

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_flow.cc
# Opt level: O0

void __thiscall FlowDecl::GenNewDataUnit(FlowDecl *this,Output *out_cc)

{
  bool bVar1;
  int iVar2;
  ParameterizedType *this_00;
  char *pcVar3;
  ID *in_RSI;
  Env *in_RDI;
  Type *unit_datatype;
  Env *in_stack_00000050;
  Output *in_stack_00000058;
  AnalyzerDataUnit *in_stack_00000060;
  
  this_00 = AnalyzerDataUnit::data_type
                      ((AnalyzerDataUnit *)
                       in_RDI[2].id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  AnalyzerDataUnit::GenNewDataUnit(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  bVar1 = Type::buffer_input(&this_00->super_Type);
  if ((bVar1) &&
     (iVar2 = (*(this_00->super_Type).super_DataDepElement._vptr_DataDepElement[0x16])(), iVar2 == 2
     )) {
    pcVar3 = Env::LValue(in_RDI,in_RSI);
    Output::println((Output *)in_RSI,"%s->NewFrame(0, false);",pcVar3);
  }
  AnalyzerDataUnit::GenNewContext(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  return;
}

Assistant:

void FlowDecl::GenNewDataUnit(Output* out_cc)
	{
	Type* unit_datatype = dataunit_->data_type();
	// dataunit_->data_type()->GenPreParsing(out_cc, env_);
	dataunit_->GenNewDataUnit(out_cc, env_);
	if ( unit_datatype->buffer_input() && unit_datatype->buffer_mode() == Type::BUFFER_BY_LENGTH )
		{
		out_cc->println("%s->NewFrame(0, false);", env_->LValue(flow_buffer_id));
		}
	dataunit_->GenNewContext(out_cc, env_);
	}